

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-decoder-CH.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  istream *piVar4;
  Tensor *t;
  string *psVar5;
  int j;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  pointer pIVar9;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar13 [64];
  char **argv_local;
  double local_990;
  pointer local_988;
  uint doverall;
  uint dpredict;
  pointer local_978;
  double dcorr;
  string fname;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  results;
  vector<Instance,_std::allocator<Instance>_> dev;
  string line;
  int argc_local;
  Model model;
  int total;
  vector<Instance,_std::allocator<Instance>_> training;
  text_iarchive ia;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_7b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_7a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_788;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_770;
  undefined1 local_758 [16];
  ofstream out;
  RNNLanguageModel<cnn::FastLSTMBuilder> lm;
  ifstream in;
  
  argv_local = argv;
  argc_local = argc;
  cnn::Initialize(&argc_local,&argv_local,0x7c5,false);
  if (argc_local == 4) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    line._M_string_length = 0;
    training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    line.field_2._M_local_buf[0] = '\0';
    poVar3 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
    poVar3 = std::operator<<(poVar3,argv_local[1]);
    std::operator<<(poVar3,"...\n");
    total = 0;
    fname._M_dataplus._M_p._0_4_ = 0;
    std::ifstream::ifstream(&lm,argv_local[1],_S_in);
    if ((*(byte *)((long)&lm.p_wordpadding1 +
                  *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
      __assert_fail("in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                    ,0x1de,"int main(int, char **)");
    }
    iVar7 = 0;
    iVar11 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&lm,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      ia._16_8_ = 0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _out = (Parameters *)0x0;
      ia.super_text_iarchive_impl<boost::archive::text_iarchive> =
           (text_iarchive_impl<boost::archive::text_iarchive>)0x0;
      ia._1_7_ = 0;
      ia._8_8_ = 0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&out,&wd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&model,&cd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&ia,&ld,(int *)&fname,&total);
      if ((-(long)_out >> 2 != (long)(ia._8_8_ - ia._0_8_) / 0x18) ||
         (-(long)_out >> 2 !=
          ((long)model.all_params.
                 super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)model.all_params.
                super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        __assert_fail("x.size() == y.size() && x.size() == c.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                      ,0x1e5,"int main(int, char **)");
      }
      if (_out == (Parameters *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&line);
        std::endl<char,std::char_traits<char>>(poVar3);
        abort();
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_770,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_788,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&ia);
      Instance::Instance((Instance *)&in,(vector<int,_std::allocator<int>_> *)&out,&local_770,
                         &local_788);
      std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>
                (&training,(Instance *)&in);
      Instance::~Instance((Instance *)&in);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_788);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_770);
      iVar7 = iVar7 + (int)((ulong)-(long)_out >> 2);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&ia);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&out);
      iVar11 = iVar11 + 1;
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,iVar11);
    poVar3 = std::operator<<(poVar3," lines, ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
    poVar3 = std::operator<<(poVar3," tokens, ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," types\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,(float)(int)fname._M_dataplus._M_p / (float)total);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"Tags: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ifstream::~ifstream(&lm);
    wd.frozen = true;
    std::__cxx11::string::string((string *)&lm,"*UNK*",(allocator *)&in);
    cnn::Dict::SetUnk(&wd,(string *)&lm);
    std::__cxx11::string::~string((string *)&lm);
    std::__cxx11::string::string((string *)&lm,"NULL",(allocator *)&in);
    endlabel = cnn::Dict::Convert(&ld,(string *)&lm);
    std::__cxx11::string::~string((string *)&lm);
    ld.frozen = true;
    cd.frozen = true;
    std::__cxx11::string::string((string *)&lm,"*UNK*",(allocator *)&in);
    cnn::Dict::SetUnk(&cd,(string *)&lm);
    std::__cxx11::string::~string((string *)&lm);
    std::__cxx11::string::string((string *)&lm,"*UNK*",(allocator *)&in);
    cnn::Dict::SetUnk(&ld,(string *)&lm);
    std::__cxx11::string::~string((string *)&lm);
    VOCAB_SIZE = (uint)((ulong)((long)wd.words_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)wd.words_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    CHAR_SIZE = (uint)((ulong)((long)cd.words_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)cd.words_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
    LABEL_SIZE = (uint)((ulong)((long)ld.words_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)ld.words_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
    poVar3 = std::operator<<(poVar3,argv_local[2]);
    std::operator<<(poVar3,"...\n");
    total = 0;
    fname._M_dataplus._M_p._0_4_ = 0;
    std::ifstream::ifstream(&lm,argv_local[2],_S_in);
    if ((*(byte *)((long)&lm.p_wordpadding1 +
                  *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
      __assert_fail("in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                    ,0x201,"int main(int, char **)");
    }
    iVar11 = 0;
    iVar7 = 0;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&lm,(string *)&line);
      auVar12 = in_ZMM2._0_16_;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      ia._16_8_ = 0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _out = (Parameters *)0x0;
      ia.super_text_iarchive_impl<boost::archive::text_iarchive> =
           (text_iarchive_impl<boost::archive::text_iarchive>)0x0;
      ia._1_7_ = 0;
      ia._8_8_ = 0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&out,&wd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&model,&cd,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&ia,&ld,(int *)&fname,&total);
      if (-(long)_out >> 2 != (long)(ia._8_8_ - ia._0_8_) / 0x18) {
        __assert_fail("x.size() == y.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-decoder-CH.cc"
                      ,0x208,"int main(int, char **)");
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_7a0,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_7b8,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&ia);
      Instance::Instance((Instance *)&in,(vector<int,_std::allocator<int>_> *)&out,&local_7a0,
                         &local_7b8);
      std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>(&dev,(Instance *)&in)
      ;
      Instance::~Instance((Instance *)&in);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_7b8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_7a0);
      iVar7 = iVar7 + (int)((ulong)-(long)_out >> 2);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&model);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&ia);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&out);
      iVar11 = iVar11 + 1;
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,iVar11);
    poVar3 = std::operator<<(poVar3," lines, ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
    std::operator<<(poVar3," tokens\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,(float)(int)fname._M_dataplus._M_p / (float)total);
    std::operator<<(poVar3,"\n");
    std::ifstream::~ifstream(&lm);
    model.lookup_params.
    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.gradient_norm_scratch = (float *)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.lookup_params.
    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.lookup_params.
    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auVar13 = ZEXT1664(auVar12);
    RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel(&lm,&model);
    std::__cxx11::string::string((string *)&fname,argv_local[3],(allocator *)&in);
    std::ifstream::ifstream(&in,(string *)&fname,_S_in);
    boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
    boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
    invoke<cnn::Model>(&ia,&model);
    std::__cxx11::string::assign((char *)&fname);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&total,
                   &fname,"OUT");
    std::ofstream::ofstream(&out,(string *)&total,_S_out);
    std::__cxx11::string::~string((string *)&total);
    doverall = 0;
    dcorr = 0.0;
    dpredict = 0;
    eval = true;
    local_978 = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                super__Vector_impl_data._M_finish;
    for (pIVar9 = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                  super__Vector_impl_data._M_start; auVar12 = auVar13._0_16_, pIVar9 != local_978;
        pIVar9 = pIVar9 + 1) {
      cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&total);
      results.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      results.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      results.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                ((RNNLanguageModel<cnn::FastLSTMBuilder> *)local_758,
                 (vector<int,_std::allocator<int>_> *)&lm,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)pIVar9,&pIVar9->chars,&pIVar9->labels,(ComputationGraph *)&results,
                 (double *)&total,(uint *)&dcorr,&dpredict,SUB81(&doverall,0));
      t = cnn::ComputationGraph::forward((ComputationGraph *)&total);
      cnn::as_scalar(t);
      uVar8 = 0;
      local_988 = pIVar9;
      while (pIVar9 = local_988,
            uVar8 < (ulong)(((long)results.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)results.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        lVar10 = 0;
        local_990 = (double)uVar8;
        for (uVar6 = 0;
            piVar1 = results.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start,
            uVar6 < (ulong)((long)results.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
            uVar6 = uVar6 + 1) {
          psVar5 = cnn::Dict::Convert_abi_cxx11_(&ld,(int *)((long)piVar1 + lVar10));
          poVar3 = std::operator<<((ostream *)&out,(string *)psVar5);
          std::operator<<(poVar3," ");
          lVar10 = lVar10 + 4;
        }
        std::operator<<((ostream *)&out,"||| ");
        uVar8 = (long)local_990 + 1;
      }
      std::operator<<((ostream *)&out,"\n");
      std::ostream::flush();
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&results);
      cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&total);
    }
    std::ofstream::close();
    eval = false;
    local_990 = dcorr;
    auVar2 = vcvtusi2sd_avx512f(auVar12,dpredict);
    local_988 = auVar2._0_8_;
    auVar12 = vcvtusi2sd_avx512f(auVar12,doverall);
    local_978 = auVar12._0_8_;
    std::operator<<((ostream *)&std::cerr,"\n***DEV P = ");
    local_988 = (pointer)(local_990 / (double)local_988);
    poVar3 = std::ostream::_M_insert<double>((double)local_988);
    std::operator<<(poVar3," R = ");
    local_990 = local_990 / (double)local_978;
    poVar3 = std::ostream::_M_insert<double>(local_990);
    std::operator<<(poVar3," F=");
    poVar3 = std::ostream::_M_insert<double>
                       (((double)local_988 * (local_990 + local_990)) /
                        (local_990 + (double)local_988));
    std::operator<<(poVar3,' ');
    std::ofstream::~ofstream(&out);
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&ia.super_text_iarchive_impl<boost::archive::text_iarchive>);
    std::ifstream::~ifstream(&in);
    std::__cxx11::string::~string((string *)&fname);
    RNNLanguageModel<cnn::FastLSTMBuilder>::~RNNLanguageModel(&lm);
    cnn::Model::~Model(&model);
    std::__cxx11::string::~string((string *)&line);
    std::vector<Instance,_std::allocator<Instance>_>::~vector(&dev);
    std::vector<Instance,_std::allocator<Instance>_>::~vector(&training);
    iVar7 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv_local);
    std::operator<<(poVar3," corpus.txt dev.txt [model.params]\n");
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv, 1989);
  if (argc != 4) {
    cerr << "Usage: " << argv[0] << " corpus.txt dev.txt [model.params]\n";
    return 1;
  }
  vector<Instance> training,dev;
  string line;

  int tlc = 0;
  int ttoks = 0;
  
  cerr << "Reading training data from " << argv[1] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[1]);
    assert(in);
    while(getline(in, line)) {
      ++tlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size() && x.size() == c.size());
      if (x.size() == 0) { cerr << line << endl; abort(); }
      training.push_back(Instance(x,c,y));
      ttoks += x.size();
    }
    cerr << tlc << " lines, " << ttoks << " tokens, " << wd.size() << " types\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
    cerr << "Tags: " << ld.size() << endl;
  }
  wd.Freeze();
  wd.SetUnk("*UNK*");
  endlabel = ld.Convert("NULL");
  cd.Freeze();
  ld.Freeze(); // no new tag types allowed

  cd.SetUnk("*UNK*");
  ld.SetUnk("*UNK*");  
  VOCAB_SIZE = wd.size();
  CHAR_SIZE = cd.size();
  LABEL_SIZE = ld.size();

  int dlc = 0;
  int dtoks = 0;
  cerr << "Reading dev data from " << argv[2] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[2]);
    assert(in);
    while(getline(in, line)) {
      ++dlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size());
      dev.push_back(Instance(x,c,y));
      dtoks += x.size();
    }
    cerr << dlc << " lines, " << dtoks << " tokens\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
  }
  Model model;

  RNNLanguageModel<FastLSTMBuilder> lm(model);
  //RNNLanguageModel<SimpleRNNBuilder> lm(model);
    string fname = argv[3];
    ifstream in(fname);
    boost::archive::text_iarchive ia(in);
    ia >> model;

	fname = argv[2];
  ofstream out(fname+"OUT");
      double dloss = 0;
      unsigned dpredict = 0;
      unsigned doverall = 0;
      double dcorr = 0;
	eval = true;
      for (auto& sent : dev) {
        ComputationGraph cg;
        vector< vector<int> > results;
	lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, results, cg, &dcorr, &dpredict, &doverall, false);
        dloss += as_scalar(cg.forward());
        for(int i = 0; i < results.size(); i ++){
                for(int j = 0; j < results[i].size(); j ++){
                        out << ld.Convert(results[i][j]) <<" ";
                }
                out<<"||| ";
        }
        out<<"\n";
        out.flush();
      }
	out.close();
      //lm.p_th2t->scale_parameters(1/pdrop);
      eval = false;
      double P = (dcorr / dpredict);
      double R = (dcorr / doverall);
      double F = 2*P*R / (P+R);
      cerr << "\n***DEV P = " << P << " R = " << R << " F=" << F << ' ';
}